

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_boolean_test.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformBooleanTest(Transformer *this,PGBooleanTest *node)

{
  NotImplementedException *this_00;
  long in_RDX;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> argument
  ;
  undefined1 local_80 [56];
  string local_48;
  
  TransformExpression((Transformer *)local_80,(optional_ptr<duckdb_libpgquery::PGNode,_true>)node);
  switch(*(undefined4 *)(in_RDX + 0x10)) {
  case 0:
    local_80._48_8_ = local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestInternal
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_80 + 0x30),COMPARE_BOUNDARY_END,true,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_80._48_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_80._48_8_)->ptr->options)();
    }
    local_80._48_8_ = 0;
    break;
  case 1:
    local_80._40_8_ = local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestInternal
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_80 + 0x28),COMPARE_DISTINCT_FROM,true,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_80._40_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_80._40_8_)->ptr->options)();
    }
    local_80._40_8_ = (_Hash_node_base *)0x0;
    break;
  case 2:
    local_80._32_8_ = local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestInternal
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_80 + 0x20),COMPARE_BOUNDARY_END,false,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_80._32_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_80._32_8_)->ptr->options)();
    }
    local_80._32_8_ = 0;
    break;
  case 3:
    local_80._24_8_ = local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestInternal
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_80 + 0x18),COMPARE_DISTINCT_FROM,false,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_80._24_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_80._24_8_)->ptr->options)();
    }
    local_80._24_8_ = (__buckets_ptr)0x0;
    break;
  case 4:
    local_80._16_8_ = local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestIsNull
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_80 + 0x10),OPERATOR_IS_NULL,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_80._16_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_80._16_8_)->ptr->options)();
    }
    local_80._16_8_ = 0;
    break;
  case 5:
    local_80._8_8_ = local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestIsNull
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_80 + 8),OPERATOR_IS_NOT_NULL,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_80._8_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_80._8_8_)->ptr->options)();
    }
    local_80._8_8_ = (ParserOptions *)0x0;
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unknown boolean test type %d","");
    NotImplementedException::NotImplementedException<duckdb_libpgquery::PGBoolTestType>
              (this_00,&local_48,*(PGBoolTestType *)(in_RDX + 0x10));
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((Transformer *)local_80._0_8_ != (Transformer *)0x0) {
    (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_80._0_8_)->ptr->options)();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformBooleanTest(duckdb_libpgquery::PGBooleanTest &node) {
	auto argument = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(node.arg));

	switch (node.booltesttype) {
	case duckdb_libpgquery::PGBoolTestType::PG_IS_TRUE:
		return TransformBooleanTestInternal(std::move(argument), ExpressionType::COMPARE_NOT_DISTINCT_FROM, true,
		                                    node.location);
	case duckdb_libpgquery::PGBoolTestType::IS_NOT_TRUE:
		return TransformBooleanTestInternal(std::move(argument), ExpressionType::COMPARE_DISTINCT_FROM, true,
		                                    node.location);
	case duckdb_libpgquery::PGBoolTestType::IS_FALSE:
		return TransformBooleanTestInternal(std::move(argument), ExpressionType::COMPARE_NOT_DISTINCT_FROM, false,
		                                    node.location);
	case duckdb_libpgquery::PGBoolTestType::IS_NOT_FALSE:
		return TransformBooleanTestInternal(std::move(argument), ExpressionType::COMPARE_DISTINCT_FROM, false,
		                                    node.location);
	case duckdb_libpgquery::PGBoolTestType::IS_UNKNOWN: // IS NULL
		return TransformBooleanTestIsNull(std::move(argument), ExpressionType::OPERATOR_IS_NULL, node.location);
	case duckdb_libpgquery::PGBoolTestType::IS_NOT_UNKNOWN: // IS NOT NULL
		return TransformBooleanTestIsNull(std::move(argument), ExpressionType::OPERATOR_IS_NOT_NULL, node.location);
	default:
		throw NotImplementedException("Unknown boolean test type %d", node.booltesttype);
	}
}